

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall wasm::RandomLattice::RandomLattice(RandomLattice *this,Random *rand,size_t depth)

{
  undefined8 depth_00;
  size_t rand_00;
  uint32_t uVar1;
  RandomLattice local_2c0;
  SharedPath<wasm::RandomLattice> local_2b0;
  LatticeImpl local_288;
  undefined1 local_258 [24];
  RandomLattice local_240;
  Tuple<wasm::RandomLattice,_wasm::RandomLattice> local_230;
  LatticeImpl local_210;
  undefined1 local_1e0 [24];
  Vector<wasm::RandomLattice> local_1c8;
  LatticeImpl local_1b0;
  undefined1 local_180 [24];
  Array<wasm::RandomLattice,_2UL> local_168;
  LatticeImpl local_158;
  undefined1 local_128 [24];
  Lift<wasm::RandomLattice> local_110;
  LatticeImpl local_100;
  undefined1 local_d0 [16];
  LatticeImpl local_c0;
  undefined1 local_90 [16];
  RandomFullLattice local_80;
  LatticeImpl local_70;
  undefined1 local_40 [36];
  uint32_t pick;
  size_t depth_local;
  Random *rand_local;
  RandomLattice *this_local;
  
  this->rand = rand;
  unique0x100007fe = depth;
  depth_local = (size_t)rand;
  rand_local = (Random *)this;
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,std::default_delete<wasm::RandomLattice::LatticeImpl>>
  ::unique_ptr<std::default_delete<wasm::RandomLattice::LatticeImpl>,void>
            ((unique_ptr<wasm::RandomLattice::LatticeImpl,std::default_delete<wasm::RandomLattice::LatticeImpl>>
              *)&this->lattice);
  local_40._28_4_ = Random::upTo((Random *)depth_local,0xd);
  rand_00 = depth_local;
  depth_00 = stack0xffffffffffffffe0;
  if ((uint)local_40._28_4_ < 7) {
    std::optional<unsigned_int>::optional<unsigned_int_&,_true>
              ((optional<unsigned_int> *)(local_90 + 8),(uint *)(local_40 + 0x1c));
    RandomFullLattice::RandomFullLattice
              (&local_80,(Random *)rand_00,depth_00,(optional<unsigned_int>)local_90._8_8_);
    std::
    variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
    ::variant<wasm::RandomFullLattice,void,void,wasm::RandomFullLattice,void>
              ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                *)&local_70,&local_80);
    std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
              ((LatticeImpl *)local_40);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::operator=(&this->lattice,
                (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                 *)local_40);
    std::
    unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_40);
    LatticeImpl::~LatticeImpl(&local_70);
    RandomFullLattice::~RandomFullLattice(&local_80);
  }
  else {
    switch(local_40._28_4_) {
    case 7:
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::Flat<unsigned_int>,void,void,wasm::analysis::Flat<unsigned_int>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_c0,(Flat<unsigned_int> *)(local_d0 + 0xf));
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_90);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_90);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_90);
      LatticeImpl::~LatticeImpl(&local_c0);
      break;
    case 8:
      RandomLattice((RandomLattice *)(local_128 + 8),(Random *)depth_local,
                    stack0xffffffffffffffe0 + 1);
      analysis::Lift<wasm::RandomLattice>::Lift(&local_110,(RandomLattice *)(local_128 + 8));
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::Lift<wasm::RandomLattice>,void,void,wasm::analysis::Lift<wasm::RandomLattice>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_100,&local_110);
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_d0);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_d0);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_d0);
      LatticeImpl::~LatticeImpl(&local_100);
      analysis::Lift<wasm::RandomLattice>::~Lift(&local_110);
      ~RandomLattice((RandomLattice *)(local_128 + 8));
      break;
    case 9:
      RandomLattice((RandomLattice *)(local_180 + 8),(Random *)depth_local,
                    stack0xffffffffffffffe0 + 1);
      analysis::Array<wasm::RandomLattice,_2UL>::Array(&local_168,(RandomLattice *)(local_180 + 8));
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::Array<wasm::RandomLattice,2ul>,void,void,wasm::analysis::Array<wasm::RandomLattice,2ul>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_158,&local_168);
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_128);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_128);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_128);
      LatticeImpl::~LatticeImpl(&local_158);
      analysis::Array<wasm::RandomLattice,_2UL>::~Array(&local_168);
      ~RandomLattice((RandomLattice *)(local_180 + 8));
      break;
    case 10:
      RandomLattice((RandomLattice *)(local_1e0 + 8),(Random *)depth_local,
                    stack0xffffffffffffffe0 + 1);
      uVar1 = Random::upTo((Random *)depth_local,4);
      analysis::Vector<wasm::RandomLattice>::Vector
                (&local_1c8,(RandomLattice *)(local_1e0 + 8),(ulong)uVar1);
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::Vector<wasm::RandomLattice>,void,void,wasm::analysis::Vector<wasm::RandomLattice>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_1b0,&local_1c8);
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_180);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_180);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_180);
      LatticeImpl::~LatticeImpl(&local_1b0);
      analysis::Vector<wasm::RandomLattice>::~Vector(&local_1c8);
      ~RandomLattice((RandomLattice *)(local_1e0 + 8));
      break;
    case 0xb:
      RandomLattice(&local_240,(Random *)depth_local,stack0xffffffffffffffe0 + 1);
      RandomLattice((RandomLattice *)(local_258 + 8),(Random *)depth_local,
                    stack0xffffffffffffffe0 + 1);
      analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>::Tuple
                (&local_230,&local_240,(RandomLattice *)(local_258 + 8));
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,void,void,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_210,&local_230);
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_1e0);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_1e0);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_1e0);
      LatticeImpl::~LatticeImpl(&local_210);
      analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>::~Tuple(&local_230);
      ~RandomLattice((RandomLattice *)(local_258 + 8));
      ~RandomLattice(&local_240);
      break;
    case 0xc:
      RandomLattice(&local_2c0,(Random *)depth_local,stack0xffffffffffffffe0 + 1);
      analysis::SharedPath<wasm::RandomLattice>::SharedPath(&local_2b0,&local_2c0);
      std::
      variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
      ::
      variant<wasm::analysis::SharedPath<wasm::RandomLattice>,void,void,wasm::analysis::SharedPath<wasm::RandomLattice>,void>
                ((variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                  *)&local_288,&local_2b0);
      std::make_unique<wasm::RandomLattice::LatticeImpl,wasm::RandomLattice::LatticeImpl>
                ((LatticeImpl *)local_258);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::operator=(&this->lattice,
                  (unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   *)local_258);
      std::
      unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ::~unique_ptr((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     *)local_258);
      LatticeImpl::~LatticeImpl(&local_288);
      analysis::SharedPath<wasm::RandomLattice>::~SharedPath(&local_2b0);
      ~RandomLattice(&local_2c0);
      break;
    default:
      wasm::handle_unreachable
                ("unexpected pick",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
                 ,0x115);
    }
  }
  return;
}

Assistant:

RandomLattice::RandomLattice(Random& rand, size_t depth) : rand(rand) {
  // TODO: Limit the depth once we get lattices with more fan-out.
  uint32_t pick = rand.upTo(FullLatticePicks + 6);

  if (pick < FullLatticePicks) {
    lattice = std::make_unique<LatticeImpl>(
      LatticeImpl{RandomFullLattice{rand, depth, pick}});
    return;
  }

  switch (pick) {
    case FullLatticePicks + 0:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{Flat<uint32_t>{}});
      return;
    case FullLatticePicks + 1:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Lift{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 2:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{ArrayLattice{RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 3:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{Vector{RandomLattice{rand, depth + 1}, rand.upTo(4)}});
      return;
    case FullLatticePicks + 4:
      lattice = std::make_unique<LatticeImpl>(LatticeImpl{TupleLattice{
        RandomLattice{rand, depth + 1}, RandomLattice{rand, depth + 1}}});
      return;
    case FullLatticePicks + 5:
      lattice = std::make_unique<LatticeImpl>(
        LatticeImpl{SharedPath{RandomLattice{rand, depth + 1}}});
      return;
  }
  WASM_UNREACHABLE("unexpected pick");
}